

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# half.cpp
# Opt level: O1

istream * operator>>(istream *is,half *h)

{
  char cVar1;
  ushort uVar2;
  uint uVar3;
  uint uVar4;
  float f;
  uint local_1c;
  
  std::istream::_M_extract<float>((float *)is);
  uVar3 = local_1c & 0x7fffffff;
  uVar2 = (ushort)(local_1c >> 0x10) & 0x8000;
  if (uVar3 < 0x38800000) {
    if ((0x33000000 < uVar3) &&
       (uVar4 = local_1c & 0x7fffff | 0x800000, cVar1 = (char)(uVar3 >> 0x17),
       uVar2 = uVar2 | (ushort)(uVar4 >> (0x7eU - cVar1 & 0x1f)),
       0x80000000 < uVar4 << (cVar1 + 0xa2U & 0x1f))) {
      uVar2 = uVar2 + 1;
    }
  }
  else if (uVar3 < 0x7f800000) {
    if (uVar3 < 0x477ff000) {
      uVar2 = (ushort)(uVar3 + 0x8000fff + (uint)((uVar3 >> 0xd & 1) != 0) >> 0xd) | uVar2;
    }
    else {
      uVar2 = uVar2 | 0x7c00;
    }
  }
  else {
    uVar2 = uVar2 | 0x7c00;
    if (uVar3 != 0x7f800000) {
      uVar3 = uVar3 >> 0xd & 0x3ff;
      uVar2 = uVar2 | (ushort)uVar3 | (ushort)(uVar3 == 0);
    }
  }
  h->_h = uVar2;
  return is;
}

Assistant:

IMATH_EXPORT istream&
operator>> (istream& is, half& h)
{
    float f;
    is >> f;
    h = half (f);
    return is;
}